

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  undefined8 *puVar1;
  long lVar2;
  size_t sVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_name;
  int local_a4;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_a4 = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_40 = local_30;
  sVar3 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,this,this + sVar3);
  if (local_a4 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_40,local_40 + local_38);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00a703cf;
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_40,local_40 + local_38);
  std::__cxx11::string::append((char *)&local_80);
  StreamableToString<int>(&local_60,&local_a4);
  uVar7 = 0xf;
  if (local_80 != local_70) {
    uVar7 = local_70[0];
  }
  if (uVar7 < local_60._M_string_length + local_78) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar8 = local_60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_60._M_string_length + local_78) goto LAB_00a702b4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
  }
  else {
LAB_00a702b4:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
  }
  local_a0 = &local_90;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_90 = *puVar1;
    uStack_88 = puVar4[3];
  }
  else {
    local_90 = *puVar1;
    local_a0 = (undefined8 *)*puVar4;
  }
  local_98 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
LAB_00a703cf:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}